

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O0

void QApplication::setEffectEnabled(UIEffect effect,bool enable)

{
  byte in_SIL;
  UIEffect in_EDI;
  int effectFlags;
  undefined4 local_c;
  
  local_c = uiEffectToFlag(in_EDI);
  if ((in_SIL & 1) == 0) {
    QApplicationPrivate::enabledAnimations =
         (local_c ^ 0xffffffff) & QApplicationPrivate::enabledAnimations;
  }
  else {
    if ((local_c & 4) != 0) {
      local_c = local_c | 2;
    }
    if ((local_c & 0x20) != 0) {
      local_c = local_c | 0x10;
    }
    QApplicationPrivate::enabledAnimations = local_c | QApplicationPrivate::enabledAnimations;
  }
  return;
}

Assistant:

void QApplication::setEffectEnabled(Qt::UIEffect effect, bool enable)
{
    int effectFlags = uiEffectToFlag(effect);
    if (enable) {
        if (effectFlags & QPlatformTheme::FadeMenuUiEffect)
            effectFlags |= QPlatformTheme::AnimateMenuUiEffect;
        if (effectFlags & QPlatformTheme::FadeTooltipUiEffect)
            effectFlags |= QPlatformTheme::AnimateTooltipUiEffect;
        QApplicationPrivate::enabledAnimations |= effectFlags;
    } else {
        QApplicationPrivate::enabledAnimations &= ~effectFlags;
    }
}